

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O3

Result __thiscall
presolve::HPresolve::singletonRow(HPresolve *this,HighsPostsolveStack *postsolve_stack,HighsInt row)

{
  HPresolveAnalysis *this_00;
  double coef;
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  HighsVarType HVar5;
  uint uVar6;
  int col;
  HighsLp *pHVar7;
  bool tightenedColUpper;
  Result RVar8;
  int iVar9;
  long lVar10;
  double *pdVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double newLower;
  double dVar15;
  double dVar16;
  double dVar17;
  double local_e8;
  HighsMatrixSlice<HighsTripletListSlice> local_50;
  
  this_00 = &this->analysis_;
  bVar4 = (this->analysis_).logging_on_;
  if (bVar4 == true) {
    HPresolveAnalysis::startPresolveRuleLog(this_00,1);
  }
  uVar6 = (this->rowroot).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[row];
  col = (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[(int)uVar6];
  coef = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[(int)uVar6];
  markRowDeleted(this,row);
  unlink(this,(char *)(ulong)uVar6);
  pHVar7 = this->model;
  dVar15 = (pHVar7->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[row];
  dVar1 = this->primal_feastol;
  if (coef <= 0.0) {
    if ((pHVar7->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[col] * coef <= dVar15 + dVar1) {
      dVar13 = (pHVar7->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[row];
      if (dVar13 - dVar1 <=
          (pHVar7->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[col] * coef) goto LAB_0030e452;
    }
    else {
      dVar13 = (pHVar7->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[row];
    }
    dVar16 = INFINITY;
    dVar15 = (double)(~-(ulong)(dVar15 < INFINITY) & 0xfff0000000000000 |
                     (ulong)(dVar15 / coef) & -(ulong)(dVar15 < INFINITY));
    if (-INFINITY < dVar13) {
      dVar16 = dVar13 / coef;
    }
  }
  else {
    if ((pHVar7->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[col] * coef <= dVar15 + dVar1) {
      dVar13 = (pHVar7->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[row];
      if (dVar13 - dVar1 <=
          (pHVar7->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[col] * coef) {
LAB_0030e452:
        HighsPostsolveStack::redundantRow(postsolve_stack,row);
        (this->analysis_).logging_on_ = bVar4;
        if (bVar4 != false) {
          HPresolveAnalysis::stopPresolveRuleLog(this_00,1);
        }
        RVar8 = checkLimits(this,postsolve_stack);
        return RVar8;
      }
    }
    else {
      dVar13 = (pHVar7->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[row];
    }
    dVar16 = (double)(~-(ulong)(dVar15 < INFINITY) & 0x7ff0000000000000 |
                     (ulong)(dVar15 / coef) & -(ulong)(dVar15 < INFINITY));
    dVar15 = -INFINITY;
    if (-INFINITY < dVar13) {
      dVar15 = dVar13 / coef;
    }
  }
  dVar12 = ABS(coef);
  dVar13 = dVar12;
  if (dVar12 <= 1.0) {
    dVar13 = 1.0;
  }
  dVar13 = dVar1 / dVar13;
  HVar5 = (pHVar7->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
          _M_impl.super__Vector_impl_data._M_start[col];
  dVar2 = (pHVar7->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[col];
  dVar14 = dVar13 + dVar2;
  dVar3 = (pHVar7->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[col];
  dVar17 = dVar3 - dVar13;
  tightenedColUpper = dVar16 < dVar17;
  if (dVar15 <= dVar14) {
    local_e8 = (double)(~-(ulong)(dVar16 < dVar17) & (ulong)dVar3 |
                       -(ulong)(dVar16 < dVar17) & (ulong)dVar16);
    newLower = dVar2;
    if ((dVar16 < dVar17) && (HVar5 != kContinuous)) {
LAB_0030e277:
      local_e8 = floor(dVar13 + dVar16);
    }
  }
  else {
    local_e8 = dVar3;
    if (HVar5 == kContinuous) {
      newLower = dVar15;
      if (dVar16 < dVar17) {
        local_e8 = dVar16;
      }
    }
    else {
      newLower = ceil(dVar15 - dVar13);
      if (dVar16 < dVar17) goto LAB_0030e277;
    }
  }
  if (dVar1 + newLower < local_e8) {
LAB_0030e2ee:
    HighsPostsolveStack::singletonRow(postsolve_stack,row,col,coef,dVar14 < dVar15,dVar16 < dVar17);
    if (dVar15 <= dVar14) goto LAB_0030e34e;
  }
  else {
    if (local_e8 < newLower - dVar1) {
      return kPrimalInfeasible;
    }
    if (newLower <= local_e8) {
      if (newLower < local_e8) {
        lVar10 = (long)(this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[col];
        if (lVar10 == -1) {
          dVar13 = 0.0;
        }
        else {
          pdVar11 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start + lVar10;
          dVar13 = 0.0;
          do {
            if (dVar13 <= ABS(*pdVar11)) {
              dVar13 = ABS(*pdVar11);
            }
            iVar9 = (int)lVar10;
            lVar10 = (long)(this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[iVar9];
            pdVar11 = pdVar11 + (lVar10 - iVar9);
          } while (lVar10 != -1);
        }
        if (dVar13 <= dVar12) {
          dVar13 = dVar12;
        }
        if ((local_e8 - newLower) * dVar13 <= dVar1) goto LAB_0030e3e0;
      }
      goto LAB_0030e2ee;
    }
LAB_0030e3e0:
    if ((dVar15 <= dVar14) || (dVar17 <= dVar16)) {
      if (dVar15 <= dVar14) {
        tightenedColUpper = newLower < dVar3;
        HighsPostsolveStack::singletonRow(postsolve_stack,row,col,coef,false,tightenedColUpper);
        local_e8 = newLower;
        goto LAB_0030e34e;
      }
      HighsPostsolveStack::singletonRow
                (postsolve_stack,row,col,coef,dVar2 < local_e8,dVar16 < dVar17);
      newLower = local_e8;
    }
    else {
      newLower = (newLower + local_e8) * 0.5;
      tightenedColUpper = newLower < dVar3;
      HighsPostsolveStack::singletonRow
                (postsolve_stack,row,col,coef,dVar2 < newLower,tightenedColUpper);
    }
    local_e8 = newLower;
    if (newLower <= dVar2) goto LAB_0030e34e;
  }
  changeColLower(this,col,newLower);
LAB_0030e34e:
  if ((local_e8 != newLower) || (NAN(local_e8) || NAN(newLower))) {
    if (tightenedColUpper) {
      changeColUpper(this,col,local_e8);
    }
  }
  else {
    local_50.nodeValue =
         (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_50.nodeIndex =
         (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start;
    local_50.nodeNext =
         (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
         ._M_start;
    local_50.head =
         (this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start[col];
    HighsPostsolveStack::removedFixedCol<HighsTripletListSlice>
              (postsolve_stack,col,newLower,
               (this->model->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[col],&local_50);
    removeFixedCol(this,col);
  }
  if (((this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start[col] == '\0') &&
     ((this->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[col] == 0)) {
    RVar8 = emptyCol(this,postsolve_stack,col);
    (this->analysis_).logging_on_ = bVar4;
    if (bVar4 != false) {
      HPresolveAnalysis::stopPresolveRuleLog(this_00,1);
    }
  }
  else {
    (this->analysis_).logging_on_ = bVar4;
    if (bVar4 != false) {
      HPresolveAnalysis::stopPresolveRuleLog(this_00,1);
    }
    RVar8 = checkLimits(this,postsolve_stack);
  }
  return RVar8;
}

Assistant:

HPresolve::Result HPresolve::singletonRow(HighsPostsolveStack& postsolve_stack,
                                          HighsInt row) {
  const bool logging_on = analysis_.logging_on_;
  if (logging_on) analysis_.startPresolveRuleLog(kPresolveRuleSingletonRow);
  assert(!rowDeleted[row]);
  assert(rowsize[row] == 1);

  // the tree of nonzeros of this row should just contain the single nonzero
  HighsInt nzPos = rowroot[row];
  assert(nzPos != -1);
  // nonzero should have the row in the row array
  assert(Arow[nzPos] == row);
  // tree with one element should not have children
  assert(ARleft[nzPos] == -1);
  assert(ARright[nzPos] == -1);

  HighsInt col = Acol[nzPos];
  double val = Avalue[nzPos];

  // printf("singleton row\n");
  // debugPrintRow(row);
  // delete row singleton nonzero directly, we have all information that we need
  // in local variables
  markRowDeleted(row);
  unlink(nzPos);

  // check for simple
  if (val > 0) {
    if (model->col_upper_[col] * val <=
            model->row_upper_[row] + primal_feastol &&
        model->col_lower_[col] * val >=
            model->row_lower_[row] - primal_feastol) {
      postsolve_stack.redundantRow(row);
      analysis_.logging_on_ = logging_on;
      if (logging_on) analysis_.stopPresolveRuleLog(kPresolveRuleSingletonRow);
      return checkLimits(postsolve_stack);
    }
  } else {
    if (model->col_lower_[col] * val <=
            model->row_upper_[row] + primal_feastol &&
        model->col_upper_[col] * val >=
            model->row_lower_[row] - primal_feastol) {
      postsolve_stack.redundantRow(row);
      analysis_.logging_on_ = logging_on;
      if (logging_on) analysis_.stopPresolveRuleLog(kPresolveRuleSingletonRow);
      return checkLimits(postsolve_stack);
    }
  }

  // zeros should not be linked in the matrix
  assert(std::fabs(val) > options->small_matrix_value);

  double newColUpper = kHighsInf;
  double newColLower = -kHighsInf;
  if (val > 0) {
    if (model->row_upper_[row] != kHighsInf)
      newColUpper = model->row_upper_[row] / val;
    if (model->row_lower_[row] != -kHighsInf)
      newColLower = model->row_lower_[row] / val;
  } else {
    if (model->row_upper_[row] != kHighsInf)
      newColLower = model->row_upper_[row] / val;
    if (model->row_lower_[row] != -kHighsInf)
      newColUpper = model->row_lower_[row] / val;
  }

  // use either the primal feasibility tolerance for the bound constraint or
  // for the singleton row including scaling, whichever is tighter.
  const double boundTol = primal_feastol / std::max(1.0, std::fabs(val));
  const bool isIntegral = model->integrality_[col] != HighsVarType::kContinuous;

  bool lowerTightened = newColLower > model->col_lower_[col] + boundTol;
  bool upperTightened = newColUpper < model->col_upper_[col] - boundTol;

  double lb, ub;
  if (lowerTightened) {
    if (isIntegral) newColLower = std::ceil(newColLower - boundTol);
    lb = newColLower;
  } else
    lb = model->col_lower_[col];

  if (upperTightened) {
    if (isIntegral) newColUpper = std::floor(newColUpper + boundTol);
    ub = newColUpper;
  } else
    ub = model->col_upper_[col];

  // printf("old bounds [%.15g,%.15g], new bounds [%.15g,%.15g] ... ",
  //        model->col_lower_[col], model->col_upper_[col], lb, ub);
  // check whether the bounds are equal in tolerances
  if (ub <= lb + primal_feastol) {
    // bounds could be infeasible or equal in tolerances, first check infeasible
    if (ub < lb - primal_feastol) return Result::kPrimalInfeasible;

    // bounds are equal in tolerances, if they have a slight infeasibility below
    // those tolerances or they have a slight numerical distance which changes
    // the largest contribution below feasibility tolerance then we can safely
    // set the bound to one of the values. To heuristically get rid of numerical
    // errors we choose the bound that was not tightened, or the midpoint if
    // both where tightened.
    if (ub < lb || (ub > lb && (ub - lb) * std::max(std::fabs(val),
                                                    getMaxAbsColVal(col)) <=
                                   primal_feastol)) {
      if (lowerTightened && upperTightened) {
        ub = 0.5 * (ub + lb);
        lb = ub;
        lowerTightened = lb > model->col_lower_[col];
        upperTightened = ub < model->col_upper_[col];
      } else if (lowerTightened) {
        lb = ub;
        lowerTightened = lb > model->col_lower_[col];
      } else {
        ub = lb;
        upperTightened = ub < model->col_upper_[col];
      }
    }
  }

  // printf("final bounds: [%.15g,%.15g]\n", lb, ub);

  postsolve_stack.singletonRow(row, col, val, lowerTightened, upperTightened);

  // just update bounds (and row activities)
  if (lowerTightened) changeColLower(col, lb);
  // update bounds, or remove as fixed column directly
  if (ub == lb) {
    postsolve_stack.removedFixedCol(col, lb, model->col_cost_[col],
                                    getColumnVector(col));
    removeFixedCol(col);
  } else if (upperTightened)
    changeColUpper(col, ub);

  if (!colDeleted[col] && colsize[col] == 0) {
    Result result = emptyCol(postsolve_stack, col);
    analysis_.logging_on_ = logging_on;
    if (logging_on) analysis_.stopPresolveRuleLog(kPresolveRuleSingletonRow);
    return result;
  }
  analysis_.logging_on_ = logging_on;
  if (logging_on) analysis_.stopPresolveRuleLog(kPresolveRuleSingletonRow);
  return checkLimits(postsolve_stack);
}